

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestMultiProcessHandler.cxx
# Opt level: O1

void __thiscall cmCTestMultiProcessHandler::RemoveTest(cmCTestMultiProcessHandler *this,int index)

{
  mapped_type_conflict1 *pmVar1;
  pair<std::_Rb_tree_iterator<std::pair<const_int,_cmCTestTestHandler::cmCTestTestProperties_*>_>,_std::_Rb_tree_iterator<std::pair<const_int,_cmCTestTestHandler::cmCTestTestProperties_*>_>_>
  pVar2;
  int local_1c;
  
  local_1c = index;
  EraseTest(this,index);
  pVar2 = std::
          _Rb_tree<int,_std::pair<const_int,_cmCTestTestHandler::cmCTestTestProperties_*>,_std::_Select1st<std::pair<const_int,_cmCTestTestHandler::cmCTestTestProperties_*>_>,_std::less<int>,_std::allocator<std::pair<const_int,_cmCTestTestHandler::cmCTestTestProperties_*>_>_>
          ::equal_range((_Rb_tree<int,_std::pair<const_int,_cmCTestTestHandler::cmCTestTestProperties_*>,_std::_Select1st<std::pair<const_int,_cmCTestTestHandler::cmCTestTestProperties_*>_>,_std::less<int>,_std::allocator<std::pair<const_int,_cmCTestTestHandler::cmCTestTestProperties_*>_>_>
                         *)&this->Properties,&local_1c);
  std::
  _Rb_tree<int,_std::pair<const_int,_cmCTestTestHandler::cmCTestTestProperties_*>,_std::_Select1st<std::pair<const_int,_cmCTestTestHandler::cmCTestTestProperties_*>_>,_std::less<int>,_std::allocator<std::pair<const_int,_cmCTestTestHandler::cmCTestTestProperties_*>_>_>
  ::_M_erase_aux((_Rb_tree<int,_std::pair<const_int,_cmCTestTestHandler::cmCTestTestProperties_*>,_std::_Select1st<std::pair<const_int,_cmCTestTestHandler::cmCTestTestProperties_*>_>,_std::less<int>,_std::allocator<std::pair<const_int,_cmCTestTestHandler::cmCTestTestProperties_*>_>_>
                  *)&this->Properties,(_Base_ptr)pVar2.first._M_node,(_Base_ptr)pVar2.second._M_node
                );
  pmVar1 = std::map<int,_bool,_std::less<int>,_std::allocator<std::pair<const_int,_bool>_>_>::
           operator[](&this->TestRunningMap,&local_1c);
  *pmVar1 = false;
  pmVar1 = std::map<int,_bool,_std::less<int>,_std::allocator<std::pair<const_int,_bool>_>_>::
           operator[](&this->TestFinishMap,&local_1c);
  *pmVar1 = true;
  this->Completed = this->Completed + 1;
  return;
}

Assistant:

void cmCTestMultiProcessHandler::RemoveTest(int index)
{
  this->EraseTest(index);
  this->Properties.erase(index);
  this->TestRunningMap[index] = false;
  this->TestFinishMap[index] = true;
  this->Completed++;
}